

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coins_tests.cpp
# Opt level: O2

void __thiscall coins_tests::ccoins_write::test_method(ccoins_write *this)

{
  char parent_flags;
  long lVar1;
  long parent_value;
  long child_value;
  char *pcVar2;
  long lVar3;
  long lVar4;
  char *pcVar5;
  long lVar6;
  undefined2 *puVar7;
  long in_FS_OFFSET;
  const_iterator __end3;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CheckWriteCoins(-2,-2,-2,-1,-1,-1);
  CheckWriteCoins(-2,-1,-1,-1,'\x01','\x01');
  CheckWriteCoins(-2,-1,-2,-1,'\x03',-1);
  CheckWriteCoins(-2,200,200,-1,'\x01','\x01');
  CheckWriteCoins(-2,200,200,-1,'\x03','\x03');
  CheckWriteCoins(-1,-2,-1,'\0',-1,'\0');
  CheckWriteCoins(-1,-2,-1,'\x02',-1,'\x02');
  CheckWriteCoins(-1,-2,-1,'\x01',-1,'\x01');
  CheckWriteCoins(-1,-2,-1,'\x03',-1,'\x03');
  CheckWriteCoins(-1,-1,-1,'\0','\x01','\x01');
  CheckWriteCoins(-1,-1,-1,'\0','\x03','\x01');
  CheckWriteCoins(-1,-1,-2,'\x02','\x01',-1);
  CheckWriteCoins(-1,-1,-2,'\x02','\x03',-1);
  CheckWriteCoins(-1,-1,-1,'\x01','\x01','\x01');
  CheckWriteCoins(-1,-1,-1,'\x01','\x03','\x01');
  CheckWriteCoins(-1,-1,-2,'\x03','\x01',-1);
  CheckWriteCoins(-1,-1,-2,'\x03','\x03',-1);
  CheckWriteCoins(-1,200,200,'\0','\x01','\x01');
  CheckWriteCoins(-1,200,200,'\0','\x03','\x01');
  CheckWriteCoins(-1,200,200,'\x02','\x01','\x03');
  CheckWriteCoins(-1,200,200,'\x02','\x03','\x03');
  CheckWriteCoins(-1,200,200,'\x01','\x01','\x01');
  CheckWriteCoins(-1,200,200,'\x01','\x03','\x01');
  CheckWriteCoins(-1,200,200,'\x03','\x01','\x03');
  CheckWriteCoins(-1,200,200,'\x03','\x03','\x03');
  CheckWriteCoins(100,-2,100,'\0',-1,'\0');
  CheckWriteCoins(100,-2,100,'\x02',-1,'\x02');
  CheckWriteCoins(100,-2,100,'\x01',-1,'\x01');
  CheckWriteCoins(100,-2,100,'\x03',-1,'\x03');
  CheckWriteCoins(100,-1,-1,'\0','\x01','\x01');
  CheckWriteCoins(100,-1,-3,'\0','\x03',-1);
  CheckWriteCoins(100,-1,-2,'\x02','\x01',-1);
  CheckWriteCoins(100,-1,-3,'\x02','\x03',-1);
  CheckWriteCoins(100,-1,-1,'\x01','\x01','\x01');
  CheckWriteCoins(100,-1,-3,'\x01','\x03',-1);
  CheckWriteCoins(100,-1,-2,'\x03','\x01',-1);
  CheckWriteCoins(100,-1,-3,'\x03','\x03',-1);
  CheckWriteCoins(100,200,200,'\0','\x01','\x01');
  CheckWriteCoins(100,200,-3,'\0','\x03',-1);
  CheckWriteCoins(100,200,200,'\x02','\x01','\x03');
  CheckWriteCoins(100,200,-3,'\x02','\x03',-1);
  CheckWriteCoins(100,200,200,'\x01','\x01','\x01');
  CheckWriteCoins(100,200,-3,'\x01','\x03',-1);
  CheckWriteCoins(100,200,200,'\x03','\x01','\x03');
  CheckWriteCoins(100,200,-3,'\x03','\x03',-1);
  for (lVar3 = 0; lVar3 != 0x18; lVar3 = lVar3 + 8) {
    parent_value = *(long *)((long)&DAT_00b69ba8 + lVar3);
    pcVar5 = "";
    if (parent_value == -2) {
      pcVar5 = &_ZGRN11coins_testsL12ABSENT_FLAGSE_;
    }
    for (lVar4 = 0; lVar4 != 0x18; lVar4 = lVar4 + 8) {
      child_value = *(long *)((long)&DAT_00b69b40 + lVar4);
      puVar7 = &_ZGRN11coins_testsL11CLEAN_FLAGSE_;
      if (child_value == -2) {
        puVar7 = (undefined2 *)&_ZGRN11coins_testsL12ABSENT_FLAGSE_;
      }
      for (pcVar2 = pcVar5; pcVar2 != pcVar5 + (ulong)(parent_value != -2) * 3 + 1;
          pcVar2 = pcVar2 + 1) {
        parent_flags = *pcVar2;
        for (lVar6 = 0; (ulong)(child_value != -2) + 1 != lVar6; lVar6 = lVar6 + 1) {
          CheckWriteCoins(parent_value,child_value,parent_value,parent_flags,
                          *(char *)((long)puVar7 + lVar6),parent_flags);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(ccoins_write)
{
    /* Check BatchWrite behavior, flushing one entry from a child cache to a
     * parent cache, and checking the resulting entry in the parent cache
     * after the write.
     *
     *              Parent  Child   Result  Parent       Child        Result
     *              Value   Value   Value   Flags        Flags        Flags
     */
    CheckWriteCoins(ABSENT, ABSENT, ABSENT, NO_ENTRY   , NO_ENTRY   , NO_ENTRY   );
    CheckWriteCoins(ABSENT, SPENT , SPENT , NO_ENTRY   , DIRTY      , DIRTY      );
    CheckWriteCoins(ABSENT, SPENT , ABSENT, NO_ENTRY   , DIRTY|FRESH, NO_ENTRY   );
    CheckWriteCoins(ABSENT, VALUE2, VALUE2, NO_ENTRY   , DIRTY      , DIRTY      );
    CheckWriteCoins(ABSENT, VALUE2, VALUE2, NO_ENTRY   , DIRTY|FRESH, DIRTY|FRESH);
    CheckWriteCoins(SPENT , ABSENT, SPENT , 0          , NO_ENTRY   , 0          );
    CheckWriteCoins(SPENT , ABSENT, SPENT , FRESH      , NO_ENTRY   , FRESH      );
    CheckWriteCoins(SPENT , ABSENT, SPENT , DIRTY      , NO_ENTRY   , DIRTY      );
    CheckWriteCoins(SPENT , ABSENT, SPENT , DIRTY|FRESH, NO_ENTRY   , DIRTY|FRESH);
    CheckWriteCoins(SPENT , SPENT , SPENT , 0          , DIRTY      , DIRTY      );
    CheckWriteCoins(SPENT , SPENT , SPENT , 0          , DIRTY|FRESH, DIRTY      );
    CheckWriteCoins(SPENT , SPENT , ABSENT, FRESH      , DIRTY      , NO_ENTRY   );
    CheckWriteCoins(SPENT , SPENT , ABSENT, FRESH      , DIRTY|FRESH, NO_ENTRY   );
    CheckWriteCoins(SPENT , SPENT , SPENT , DIRTY      , DIRTY      , DIRTY      );
    CheckWriteCoins(SPENT , SPENT , SPENT , DIRTY      , DIRTY|FRESH, DIRTY      );
    CheckWriteCoins(SPENT , SPENT , ABSENT, DIRTY|FRESH, DIRTY      , NO_ENTRY   );
    CheckWriteCoins(SPENT , SPENT , ABSENT, DIRTY|FRESH, DIRTY|FRESH, NO_ENTRY   );
    CheckWriteCoins(SPENT , VALUE2, VALUE2, 0          , DIRTY      , DIRTY      );
    CheckWriteCoins(SPENT , VALUE2, VALUE2, 0          , DIRTY|FRESH, DIRTY      );
    CheckWriteCoins(SPENT , VALUE2, VALUE2, FRESH      , DIRTY      , DIRTY|FRESH);
    CheckWriteCoins(SPENT , VALUE2, VALUE2, FRESH      , DIRTY|FRESH, DIRTY|FRESH);
    CheckWriteCoins(SPENT , VALUE2, VALUE2, DIRTY      , DIRTY      , DIRTY      );
    CheckWriteCoins(SPENT , VALUE2, VALUE2, DIRTY      , DIRTY|FRESH, DIRTY      );
    CheckWriteCoins(SPENT , VALUE2, VALUE2, DIRTY|FRESH, DIRTY      , DIRTY|FRESH);
    CheckWriteCoins(SPENT , VALUE2, VALUE2, DIRTY|FRESH, DIRTY|FRESH, DIRTY|FRESH);
    CheckWriteCoins(VALUE1, ABSENT, VALUE1, 0          , NO_ENTRY   , 0          );
    CheckWriteCoins(VALUE1, ABSENT, VALUE1, FRESH      , NO_ENTRY   , FRESH      );
    CheckWriteCoins(VALUE1, ABSENT, VALUE1, DIRTY      , NO_ENTRY   , DIRTY      );
    CheckWriteCoins(VALUE1, ABSENT, VALUE1, DIRTY|FRESH, NO_ENTRY   , DIRTY|FRESH);
    CheckWriteCoins(VALUE1, SPENT , SPENT , 0          , DIRTY      , DIRTY      );
    CheckWriteCoins(VALUE1, SPENT , FAIL  , 0          , DIRTY|FRESH, NO_ENTRY   );
    CheckWriteCoins(VALUE1, SPENT , ABSENT, FRESH      , DIRTY      , NO_ENTRY   );
    CheckWriteCoins(VALUE1, SPENT , FAIL  , FRESH      , DIRTY|FRESH, NO_ENTRY   );
    CheckWriteCoins(VALUE1, SPENT , SPENT , DIRTY      , DIRTY      , DIRTY      );
    CheckWriteCoins(VALUE1, SPENT , FAIL  , DIRTY      , DIRTY|FRESH, NO_ENTRY   );
    CheckWriteCoins(VALUE1, SPENT , ABSENT, DIRTY|FRESH, DIRTY      , NO_ENTRY   );
    CheckWriteCoins(VALUE1, SPENT , FAIL  , DIRTY|FRESH, DIRTY|FRESH, NO_ENTRY   );
    CheckWriteCoins(VALUE1, VALUE2, VALUE2, 0          , DIRTY      , DIRTY      );
    CheckWriteCoins(VALUE1, VALUE2, FAIL  , 0          , DIRTY|FRESH, NO_ENTRY   );
    CheckWriteCoins(VALUE1, VALUE2, VALUE2, FRESH      , DIRTY      , DIRTY|FRESH);
    CheckWriteCoins(VALUE1, VALUE2, FAIL  , FRESH      , DIRTY|FRESH, NO_ENTRY   );
    CheckWriteCoins(VALUE1, VALUE2, VALUE2, DIRTY      , DIRTY      , DIRTY      );
    CheckWriteCoins(VALUE1, VALUE2, FAIL  , DIRTY      , DIRTY|FRESH, NO_ENTRY   );
    CheckWriteCoins(VALUE1, VALUE2, VALUE2, DIRTY|FRESH, DIRTY      , DIRTY|FRESH);
    CheckWriteCoins(VALUE1, VALUE2, FAIL  , DIRTY|FRESH, DIRTY|FRESH, NO_ENTRY   );

    // The checks above omit cases where the child flags are not DIRTY, since
    // they would be too repetitive (the parent cache is never updated in these
    // cases). The loop below covers these cases and makes sure the parent cache
    // is always left unchanged.
    for (const CAmount parent_value : {ABSENT, SPENT, VALUE1})
        for (const CAmount child_value : {ABSENT, SPENT, VALUE2})
            for (const char parent_flags : parent_value == ABSENT ? ABSENT_FLAGS : FLAGS)
                for (const char child_flags : child_value == ABSENT ? ABSENT_FLAGS : CLEAN_FLAGS)
                    CheckWriteCoins(parent_value, child_value, parent_value, parent_flags, child_flags, parent_flags);
}